

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniball.hpp
# Opt level: O1

void __thiscall
Miniball::
Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
::pivot_mb(Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
           *this,Pit n)

{
  float fVar1;
  float fVar2;
  _List_node_base *p_Var3;
  float **ppfVar4;
  bool bVar5;
  _List_node_base *p_Var6;
  float **ppfVar7;
  long lVar8;
  Pit pit;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  do {
    fVar1 = this->current_sqr_r;
    ppfVar7 = (this->points_begin)._M_current;
    fVar2 = this->nt0;
    pit._M_current = ppfVar7;
    fVar10 = fVar2;
    if (ppfVar7 != n._M_current) {
      fVar9 = -fVar1;
      do {
        fVar11 = fVar9;
        if (0 < this->d) {
          lVar8 = 0;
          do {
            fVar12 = (*ppfVar7)[lVar8] - this->current_c[lVar8];
            fVar11 = fVar11 + fVar12 * fVar12;
            lVar8 = lVar8 + 1;
          } while (this->d != (int)lVar8);
        }
        ppfVar4 = ppfVar7;
        if (fVar11 <= fVar10) {
          fVar11 = fVar10;
          ppfVar4 = pit._M_current;
        }
        pit._M_current = ppfVar4;
        fVar10 = fVar11;
        ppfVar7 = ppfVar7 + 1;
      } while (ppfVar7 != n._M_current);
    }
    if (fVar2 < fVar10) {
      p_Var3 = (this->support_end)._M_node;
      for (p_Var6 = (this->L).
                    super__List_base<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          (p_Var6 != p_Var3 && (p_Var6[1]._M_next != (_List_node_base *)pit._M_current));
          p_Var6 = p_Var6->_M_next) {
      }
      if (p_Var6 == p_Var3) {
        if (this->fsize != 0) {
          __assert_fail("fsize == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/kmeans/../miniball/miniball.hpp"
                        ,0x18a,
                        "void Miniball::Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>>::pivot_mb(Pit) [CoordAccessor = Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>]"
                       );
        }
        bVar5 = push(this,pit);
        if (bVar5) {
          mtf_mb(this,(this->support_end)._M_node);
          this->fsize = this->fsize + -1;
          pivot_move_to_front(this,pit);
        }
      }
    }
  } while (fVar1 < this->current_sqr_r);
  return;
}

Assistant:

void Miniball<CoordAccessor>::pivot_mb (Pit n)
    {
        // Algorithm 2: pivot_mb (L_{n-1}), where L_{n-1} = [L.begin, n)
        // --------------------------------------------------------------
        // from B. Gaertner, Fast and Robust Smallest Enclosing Balls, ESA 1999,
        // http://www.inf.ethz.ch/personal/gaertner/texts/own_work/esa99_final.pdf
        NT          old_sqr_r;
        const NT*   c;
        Pit         pivot, k;
        NT          e, max_e, sqr_r;
        Cit p;
        do {
            old_sqr_r = current_sqr_r;
            sqr_r = current_sqr_r;

            pivot = points_begin;
            max_e = nt0;
            for (k = points_begin; k != n; ++k) {
                p = coord_accessor(k);
                e = -sqr_r;
                c = current_c;
                for (int j=0; j<d; ++j)
                    e += mb_sqr<NT>(*p++-*c++);
                if (e > max_e) {
                    max_e = e;
                    pivot = k;
                }
            }

            if (max_e > nt0) {
                // check if the pivot is already contained in the support set
                if (std::find(L.begin(), support_end, pivot) == support_end) {
                    assert (fsize == 0);
                    if (push (pivot)) {
                        mtf_mb(support_end);
                        pop();
                        pivot_move_to_front(pivot);
                    }
                }
            }
        } while (old_sqr_r < current_sqr_r);
    }